

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O0

bool __thiscall qclab::qgates::CX<float>::equals(CX<float> *this,QObject<float> *other)

{
  int iVar1;
  int iVar2;
  bool local_51;
  QControlledGate2<float> *local_40;
  CG *p;
  QObject<float> *other_local;
  CX<float> *this_local;
  
  if (other == (QObject<float> *)0x0) {
    local_40 = (QControlledGate2<float> *)0x0;
  }
  else {
    local_40 = (QControlledGate2<float> *)
               __dynamic_cast(other,&QObject<float>::typeinfo,&typeinfo,0);
  }
  if (local_40 != (QControlledGate2<float> *)0x0) {
    iVar1 = QControlledGate2<float>::controlState(local_40);
    iVar2 = QControlledGate2<float>::controlState(&this->super_QControlledGate2<float>);
    if (iVar1 != iVar2) {
      return false;
    }
    iVar1 = QControlledGate2<float>::control(local_40);
    iVar2 = (*(local_40->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    if (iVar1 < iVar2) {
      iVar1 = QControlledGate2<float>::control(&this->super_QControlledGate2<float>);
      iVar2 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
                _vptr_QObject[0xf])();
      if (iVar1 < iVar2) {
        return true;
      }
    }
    iVar1 = QControlledGate2<float>::control(local_40);
    iVar2 = (*(local_40->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    local_51 = false;
    if (iVar2 < iVar1) {
      iVar1 = QControlledGate2<float>::control(&this->super_QControlledGate2<float>);
      iVar2 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
                _vptr_QObject[0xf])();
      local_51 = iVar2 < iVar1;
    }
    return local_51;
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CG = CX< T > ;
          if ( const CG* p = dynamic_cast< const CG* >( &other ) ) {
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }